

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_do(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  CURLcode CVar1;
  char client_id [13];
  char local_58 [14];
  undefined2 uStack_4a;
  undefined6 uStack_48;
  undefined2 uStack_42;
  undefined2 uStack_40;
  undefined6 uStack_3e;
  undefined1 local_30 [5];
  undefined3 uStack_2b;
  undefined4 uStack_28;
  undefined1 uStack_24;
  
  data = conn->data;
  *done = false;
  uStack_28 = 0;
  uStack_24 = 0;
  local_30 = (undefined1  [5])0x6c727563;
  uStack_2b = 0;
  local_58[8] = '\x04';
  local_58[9] = '\x02';
  local_58[10] = '\0';
  local_58[0xb] = '<';
  local_58[0xc] = '\0';
  uStack_4a = 0;
  uStack_48 = 0;
  uStack_42 = 0;
  uStack_40 = 0;
  uStack_3e = 0;
  local_58[0] = '\x10';
  local_58[1] = '\x18';
  local_58[2] = '\0';
  local_58[3] = '\x04';
  local_58[4] = 'M';
  local_58[5] = 'Q';
  local_58[6] = 'T';
  local_58[7] = 'T';
  local_58[0xd] = 0xc;
  CVar1 = Curl_rand_hex(data,local_30 + 4,9);
  uStack_4a = local_30._0_2_;
  uStack_48 = (undefined6)(CONCAT35(uStack_2b,local_30) >> 0x10);
  uStack_42 = (undefined2)uStack_28;
  uStack_40 = (undefined2)((uint)uStack_28 >> 0x10);
  Curl_infof(conn->data,"Using client id \'%s\'\n",local_30);
  if (CVar1 == CURLE_OK) {
    CVar1 = mqtt_send(conn,local_58,0x1a);
  }
  if (CVar1 == CURLE_OK) {
    (conn->proto).ftpc.pp.cache = (char *)0x200000000;
    CVar1 = CURLE_OK;
  }
  else {
    Curl_failf(data,"Error %d sending MQTT CONN request",(ulong)CVar1);
  }
  return CVar1;
}

Assistant:

static CURLcode mqtt_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  *done = FALSE; /* unconditionally */

  result = mqtt_connect(conn);
  if(result) {
    failf(data, "Error %d sending MQTT CONN request", result);
    return result;
  }
  mqstate(conn, MQTT_FIRST, MQTT_CONNACK);
  return CURLE_OK;
}